

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_> __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (detail *this,back_insert_iterator<fmt::v7::detail::buffer<char>_> out,string_view bytes,
          basic_format_specs<char> *specs)

{
  char *pcVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  int *piVar3;
  char *pcVar4;
  char *data;
  ulong n;
  ulong uVar5;
  
  piVar3 = (int *)bytes.size_;
  pcVar4 = bytes.data_;
  pcVar1 = (char *)(long)*piVar3;
  if (-1 < (long)pcVar1) {
    uVar5 = 0;
    if (pcVar4 <= pcVar1) {
      uVar5 = (long)pcVar1 - (long)pcVar4;
    }
    n = uVar5 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                           (ulong)(*(byte *)((long)piVar3 + 9) & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)this,n,
                       (fill_t<char> *)((long)piVar3 + 10));
    bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (out.container,pcVar4 + (long)out.container,bVar2);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar2,uVar5 - n,(fill_t<char> *)((long)piVar3 + 10));
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, F&& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}